

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O0

bool __thiscall ON_BinaryArchive::WriteString(ON_BinaryArchive *this,ON_String *sUTF8)

{
  size_t count;
  int iVar1;
  char *p;
  bool local_25;
  ON__INT32 local_24;
  bool rc;
  size_t sStack_20;
  ON__UINT32 ui32;
  size_t string_utf8_element_count;
  ON_String *sUTF8_local;
  ON_BinaryArchive *this_local;
  
  string_utf8_element_count = (size_t)sUTF8;
  sUTF8_local = (ON_String *)this;
  ON_String::IsValid(sUTF8,false);
  iVar1 = ON_String::Length((ON_String *)string_utf8_element_count);
  sStack_20 = (size_t)iVar1;
  if (sStack_20 != 0) {
    sStack_20 = sStack_20 + 1;
  }
  local_24 = (ON__INT32)sStack_20;
  local_25 = WriteInt32(this,1,&local_24);
  count = sStack_20;
  if ((local_25) && (sStack_20 != 0)) {
    p = ON_String::Array((ON_String *)string_utf8_element_count);
    local_25 = WriteByte(this,count,p);
  }
  return local_25;
}

Assistant:

bool
ON_BinaryArchive::WriteString( const ON_String& sUTF8 )
{
  // The ON_String::IsValid call prevents corrupt strings from breaking file IO
  // The parameter MUST be false here.
  sUTF8.IsValid(false);

  size_t string_utf8_element_count = sUTF8.Length();
  if ( string_utf8_element_count )
    string_utf8_element_count++;
  ON__UINT32 ui32 = (ON__UINT32)string_utf8_element_count;
  bool rc = WriteInt32(1,(ON__INT32*)&ui32);
  if ( rc && string_utf8_element_count > 0 )
    rc = WriteByte( string_utf8_element_count, sUTF8.Array() );
  return rc;  
}